

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

UniValue *
RPCConvertNamedValues
          (UniValue *__return_storage_ptr__,string *strMethod,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *strParams)

{
  string str;
  string str_00;
  string key;
  string key_00;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  string_view arg_value;
  size_type __n;
  pointer pbVar1;
  long in_FS_OFFSET;
  basic_string_view<char,_std::char_traits<char>_> arg_value_00;
  undefined8 in_stack_fffffffffffffd98;
  pointer pbVar2;
  undefined8 in_stack_fffffffffffffda0;
  basic_string_view<char,_std::char_traits<char>_> local_258;
  string_view s;
  _Vector_impl_data local_238;
  undefined1 auStack_220 [32];
  string local_1e0 [32];
  UniValue local_1c0;
  string local_168 [32];
  string name;
  UniValue local_128;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [16];
  UniValue positional_args;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = local_48;
  local_50 = 0;
  local_48[0] = 0;
  str._M_string_length = (size_type)strMethod;
  str._M_dataplus._M_p = (pointer)__return_storage_ptr__;
  str.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
  str.field_2._8_8_ = in_stack_fffffffffffffda0;
  UniValue::UniValue(__return_storage_ptr__,VOBJ,str);
  std::__cxx11::string::~string((string *)&local_58);
  local_d0 = local_c0;
  local_c8 = 0;
  local_c0[0] = 0;
  str_00._M_string_length = (size_type)strMethod;
  str_00._M_dataplus._M_p = (pointer)__return_storage_ptr__;
  str_00.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
  str_00.field_2._8_8_ = in_stack_fffffffffffffda0;
  UniValue::UniValue(&positional_args,VARR,str_00);
  std::__cxx11::string::~string((string *)&local_d0);
  pbVar2 = (strParams->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar1 = (strParams->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar1 != pbVar2; pbVar1 = pbVar1 + 1) {
    s._M_str = (pbVar1->_M_dataplus)._M_p;
    s._M_len = pbVar1->_M_string_length;
    __n = std::basic_string_view<char,_std::char_traits<char>_>::find(&s,'=',0);
    if (__n == 0xffffffffffffffff) {
      arg_value._M_str = s._M_str;
      arg_value._M_len = s._M_len;
      CRPCConvertTable::ArgToUniValue
                (&local_128,&rpcCvtTable,arg_value,strMethod,
                 (int)(((long)positional_args.values.
                              super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)positional_args.values.
                             super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                             super__Vector_impl_data._M_start) / 0x58));
      val.val._M_dataplus._M_p = (pointer)strMethod;
      val._0_8_ = __return_storage_ptr__;
      val.val._M_string_length = (size_type)pbVar2;
      val.val.field_2._M_allocated_capacity = in_stack_fffffffffffffda0;
      val._32_16_ = local_258;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)s._M_len;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)s._M_str;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)local_238;
      UniValue::push_back(&positional_args,val);
      UniValue::~UniValue(&local_128);
    }
    else {
      local_258 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&s,0,__n);
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&name,&local_258,(allocator<char> *)&stack0xfffffffffffffda7);
      arg_value_00 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               (&s,__n + 1,0xffffffffffffffff);
      std::__cxx11::string::string(local_168,&name);
      CRPCConvertTable::ArgToUniValue(&local_1c0,&rpcCvtTable,arg_value_00,strMethod,&name);
      key._M_string_length = (size_type)strMethod;
      key._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      key.field_2._M_allocated_capacity = (size_type)pbVar2;
      key.field_2._8_8_ = in_stack_fffffffffffffda0;
      val_00.val._M_string_length = s._M_len;
      val_00._0_16_ = local_258;
      val_00.val.field_2._M_allocated_capacity = (size_type)s._M_str;
      val_00._32_24_ = local_238;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_220._0_8_;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)auStack_220._8_24_;
      UniValue::pushKV(__return_storage_ptr__,key,val_00);
      UniValue::~UniValue(&local_1c0);
      std::__cxx11::string::~string(local_168);
      std::__cxx11::string::~string((string *)&name);
    }
  }
  if (positional_args.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      positional_args.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__cxx11::string::string<std::allocator<char>>(local_1e0,"args",(allocator<char> *)&name);
    UniValue::UniValue((UniValue *)&local_238,&positional_args);
    key_00._M_string_length = (size_type)strMethod;
    key_00._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    key_00.field_2._M_allocated_capacity = (size_type)pbVar2;
    key_00.field_2._8_8_ = in_stack_fffffffffffffda0;
    val_01.val._M_string_length = s._M_len;
    val_01._0_16_ = local_258;
    val_01.val.field_2._M_allocated_capacity = (size_type)s._M_str;
    val_01._32_24_ = local_238;
    val_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_220._0_8_;
    val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data =
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)auStack_220._8_24_;
    UniValue::pushKVEnd(__return_storage_ptr__,key_00,val_01);
    UniValue::~UniValue((UniValue *)&local_238);
    std::__cxx11::string::~string(local_1e0);
  }
  UniValue::~UniValue(&positional_args);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue RPCConvertNamedValues(const std::string &strMethod, const std::vector<std::string> &strParams)
{
    UniValue params(UniValue::VOBJ);
    UniValue positional_args{UniValue::VARR};

    for (std::string_view s: strParams) {
        size_t pos = s.find('=');
        if (pos == std::string::npos) {
            positional_args.push_back(rpcCvtTable.ArgToUniValue(s, strMethod, positional_args.size()));
            continue;
        }

        std::string name{s.substr(0, pos)};
        std::string_view value{s.substr(pos+1)};

        // Intentionally overwrite earlier named values with later ones as a
        // convenience for scripts and command line users that want to merge
        // options.
        params.pushKV(name, rpcCvtTable.ArgToUniValue(value, strMethod, name));
    }

    if (!positional_args.empty()) {
        // Use pushKVEnd instead of pushKV to avoid overwriting an explicit
        // "args" value with an implicit one. Let the RPC server handle the
        // request as given.
        params.pushKVEnd("args", std::move(positional_args));
    }

    return params;
}